

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_tooltip(nk_context *ctx,char *text)

{
  byte *pbVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  nk_user_font *pnVar5;
  nk_window *pnVar6;
  long lVar7;
  nk_bool nVar8;
  nk_window *popup;
  long lVar9;
  float fVar10;
  
  if ((((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) && (text != (char *)0x0))
     && (ctx->current->layout != (nk_panel *)0x0)) {
    fVar2 = (ctx->style).window.padding.x;
    if (*text == '\0') {
      lVar9 = 0;
    }
    else {
      lVar9 = 0;
      do {
        lVar7 = lVar9 + 1;
        lVar9 = lVar9 + 1;
      } while (text[lVar7] != '\0');
    }
    fVar3 = (ctx->style).window.padding.y;
    pnVar5 = (ctx->style).font;
    fVar10 = (*pnVar5->width)(pnVar5->userdata,pnVar5->height,text,(int)lVar9);
    fVar4 = ((ctx->style).font)->height;
    nVar8 = nk_tooltip_begin(ctx,fVar10 + fVar2 * 4.0);
    if (nVar8 != 0) {
      nk_row_layout(ctx,NK_DYNAMIC,fVar3 + fVar3 + fVar4,1,0);
      nk_text_colored(ctx,text,(int)lVar9,0x11,(ctx->style).text.color);
      pnVar6 = ctx->current;
      if (pnVar6 != (nk_window *)0x0) {
        pnVar6->seq = pnVar6->seq - 1;
        pbVar1 = (byte *)((long)&pnVar6->flags + 1);
        *pbVar1 = *pbVar1 | 0x20;
        nk_popup_end(ctx);
        return;
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_tooltip(struct nk_context *ctx, const char *text)
{
const struct nk_style *style;
struct nk_vec2 padding;

int text_len;
float text_width;
float text_height;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
NK_ASSERT(text);
if (!ctx || !ctx->current || !ctx->current->layout || !text)
return;

/* fetch configuration data */
style = &ctx->style;
padding = style->window.padding;

/* calculate size of the text and tooltip */
text_len = nk_strlen(text);
text_width = style->font->width(style->font->userdata,
style->font->height, text, text_len);
text_width += (4 * padding.x);
text_height = (style->font->height + 2 * padding.y);

/* execute tooltip and fill with text */
if (nk_tooltip_begin(ctx, (float)text_width)) {
nk_layout_row_dynamic(ctx, (float)text_height, 1);
nk_text(ctx, text, text_len, NK_TEXT_LEFT);
nk_tooltip_end(ctx);
}
}